

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

bool __thiscall
tlx::CmdlineParser::ArgumentBytes64::process(ArgumentBytes64 *this,int *argc,char ***argv)

{
  bool bVar1;
  bool bVar2;
  
  if (*argc == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    bVar1 = parse_si_iec_units(**argv,this->dest_,'\0');
    if (bVar1) {
      *argc = *argc + -1;
      *argv = *argv + 1;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        if (parse_si_iec_units(argv[0], &dest_)) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }